

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall spirv_cross::Compiler::flush_phi_required(Compiler *this,BlockID from,BlockID to)

{
  BlockID *pBVar1;
  long lVar2;
  SPIRBlock *pSVar3;
  Phi *pPVar4;
  long lVar5;
  
  pSVar3 = get<spirv_cross::SPIRBlock>(this,to.id);
  pPVar4 = (pSVar3->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.ptr;
  lVar2 = (pSVar3->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.buffer_size * 0xc;
  do {
    lVar5 = lVar2;
    if (lVar5 == 0) break;
    pBVar1 = &pPVar4->parent;
    pPVar4 = pPVar4 + 1;
    lVar2 = lVar5 + -0xc;
  } while (pBVar1->id != from.id);
  return lVar5 != 0;
}

Assistant:

bool Compiler::flush_phi_required(BlockID from, BlockID to) const
{
	auto &child = get<SPIRBlock>(to);
	for (auto &phi : child.phi_variables)
		if (phi.parent == from)
			return true;
	return false;
}